

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::DescriptorIndex<std::pair<const_void_*,_int>_>::
FindAllExtensionNumbers
          (DescriptorIndex<std::pair<const_void_*,_int>_> *this,string *containing_type,
          vector<int,_std::allocator<int>_> *output)

{
  bool bVar1;
  iterator __lhs;
  map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::pair<const_void_*,_int>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::pair<const_void_*,_int>_>_>_>
  *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  bool success;
  const_iterator it;
  map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::pair<const_void_*,_int>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::pair<const_void_*,_int>_>_>_>
  *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  undefined1 uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  iterator local_78;
  _Rb_tree_const_iterator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::pair<const_void_*,_int>_>_>
  local_70;
  byte local_65;
  undefined4 local_54;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  iterator local_28;
  _Rb_tree_const_iterator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::pair<const_void_*,_int>_>_>
  local_20;
  map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::pair<const_void_*,_int>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::pair<const_void_*,_int>_>_>_>
  *local_18;
  
  this_00 = in_RDI + 3;
  local_54 = 0;
  __rhs = &local_50;
  local_18 = in_RDX;
  std::make_pair<std::__cxx11::string_const&,int>
            (in_RDI,(int *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
  __lhs = std::
          map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::pair<const_void_*,_int>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::pair<const_void_*,_int>_>_>_>
          ::lower_bound(in_stack_ffffffffffffff58,(key_type *)0x6b7768);
  local_28._M_node = __lhs._M_node;
  std::
  _Rb_tree_const_iterator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::pair<const_void_*,_int>_>_>
  ::_Rb_tree_const_iterator(&local_20,&local_28);
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  ~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
         *)0x6b779b);
  local_65 = 0;
  while( true ) {
    local_78._M_node =
         (_Base_ptr)
         std::
         map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::pair<const_void_*,_int>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::pair<const_void_*,_int>_>_>_>
         ::end(in_stack_ffffffffffffff58);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::pair<const_void_*,_int>_>_>
    ::_Rb_tree_const_iterator(&local_70,&local_78);
    bVar1 = std::operator!=(&local_20,&local_70);
    uVar2 = false;
    if (bVar1) {
      std::
      _Rb_tree_const_iterator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::pair<const_void_*,_int>_>_>
      ::operator->((_Rb_tree_const_iterator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::pair<const_void_*,_int>_>_>
                    *)0x6b77f0);
      uVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __lhs._M_node,__rhs);
    }
    if ((__type)uVar2 == false) break;
    in_stack_ffffffffffffff58 = local_18;
    std::
    _Rb_tree_const_iterator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::pair<const_void_*,_int>_>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::pair<const_void_*,_int>_>_>
                  *)0x6b7827);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)this_00,(value_type_conflict *)in_RDI);
    local_65 = 1;
    std::
    _Rb_tree_const_iterator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::pair<const_void_*,_int>_>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::pair<const_void_*,_int>_>_>
                  *)CONCAT17(uVar2,in_stack_ffffffffffffff60));
  }
  return (bool)(local_65 & 1);
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::FindAllExtensionNumbers(
    const std::string& containing_type, std::vector<int>* output) {
  typename std::map<std::pair<std::string, int>, Value>::const_iterator it =
      by_extension_.lower_bound(std::make_pair(containing_type, 0));
  bool success = false;

  for (; it != by_extension_.end() && it->first.first == containing_type;
       ++it) {
    output->push_back(it->first.second);
    success = true;
  }

  return success;
}